

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AutoincrementEnd(Parse *pParse)

{
  int iVar1;
  sqlite3 *psVar2;
  Vdbe *p;
  Db *pDVar3;
  int p3;
  uint uVar4;
  uint uVar5;
  int p2;
  uint uVar6;
  int iVar7;
  AutoincInfo *pAVar8;
  
  psVar2 = pParse->db;
  p = pParse->pVdbe;
  pAVar8 = (AutoincInfo *)&pParse->pAinc;
  while (pAVar8 = pAVar8->pNext, pAVar8 != (AutoincInfo *)0x0) {
    pDVar3 = psVar2->aDb;
    iVar1 = pAVar8->iDb;
    iVar7 = pAVar8->regCtr;
    p3 = sqlite3GetTempReg(pParse);
    sqlite3OpenTable(pParse,0,pAVar8->iDb,(pDVar3[iVar1].pSchema)->pSeqTab,0x28);
    iVar1 = iVar7 + 1;
    uVar4 = sqlite3VdbeAddOp1(p,0x4a,iVar1);
    uVar5 = sqlite3VdbeAddOp0(p,0x48);
    p2 = sqlite3VdbeAddOp3(p,0x1d,0,0,p3);
    iVar7 = iVar7 + -1;
    uVar6 = sqlite3VdbeAddOp3(p,0x4c,iVar7,0,p3);
    sqlite3VdbeAddOp2(p,0x5f,0,p2);
    if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
      p->aOp[uVar5].p2 = p->nOp;
    }
    sqlite3VdbeAddOp2(p,0x38,0,iVar1);
    uVar5 = sqlite3VdbeAddOp0(p,1);
    if ((-1 < (int)uVar6) && (uVar6 < (uint)p->nOp)) {
      p->aOp[uVar6].p2 = p->nOp;
    }
    sqlite3VdbeAddOp2(p,0x41,0,iVar1);
    if ((-1 < (int)uVar4) && (uVar4 < (uint)p->nOp)) {
      p->aOp[uVar4].p2 = p->nOp;
    }
    if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
      p->aOp[uVar5].p2 = p->nOp;
    }
    sqlite3VdbeAddOp3(p,0x1f,iVar7,2,p3);
    sqlite3VdbeAddOp3(p,0x39,0,p3,iVar1);
    if (p->aOp != (Op *)0x0) {
      p->aOp[(long)p->nOp + -1].p5 = '\b';
    }
    sqlite3VdbeAddOp0(p,0x2d);
    sqlite3ReleaseTempReg(pParse,p3);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoincrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    Db *pDb = &db->aDb[p->iDb];
    int j1, j2, j3, j4, j5;
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    j1 = sqlite3VdbeAddOp1(v, OP_NotNull, memId+1);
    j2 = sqlite3VdbeAddOp0(v, OP_Rewind);
    j3 = sqlite3VdbeAddOp3(v, OP_Column, 0, 0, iRec);
    j4 = sqlite3VdbeAddOp3(v, OP_Eq, memId-1, 0, iRec);
    sqlite3VdbeAddOp2(v, OP_Next, 0, j3);
    sqlite3VdbeJumpHere(v, j2);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, memId+1);
    j5 = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, j4);
    sqlite3VdbeAddOp2(v, OP_Rowid, 0, memId+1);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3VdbeJumpHere(v, j5);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, memId-1, 2, iRec);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, iRec, memId+1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}